

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageStack.h
# Opt level: O0

bool __thiscall
PageStack<FinalizableObject_*>::Pop(PageStack<FinalizableObject_*> *this,FinalizableObject **item)

{
  Chunk *chunk;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Chunk *temp;
  FinalizableObject **item_local;
  PageStack<FinalizableObject_*> *this_local;
  
  if (this->currentChunk == (Chunk *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/PageStack.h"
                       ,0x4b,"(currentChunk != nullptr)","currentChunk != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (this->nextEntry == this->chunkStart) {
    if (this->currentChunk->nextChunk == (Chunk *)0x0) {
      if (this->count != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/PageStack.h"
                           ,0x53,"(count == 0)","count == 0");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      return false;
    }
    chunk = this->currentChunk;
    this->currentChunk = this->currentChunk->nextChunk;
    FreeChunk(this,chunk);
    this->chunkStart = (FinalizableObject **)(this->currentChunk + 1);
    this->chunkEnd = (FinalizableObject **)(this->currentChunk + 0x80);
    this->nextEntry = this->chunkEnd;
  }
  if ((this->nextEntry <= this->chunkStart) || (this->chunkEnd < this->nextEntry)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/PageStack.h"
                       ,0x60,"(nextEntry > chunkStart && nextEntry <= chunkEnd)",
                       "nextEntry > chunkStart && nextEntry <= chunkEnd");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this->nextEntry = this->nextEntry + -1;
  *item = *this->nextEntry;
  this->count = this->count - 1;
  if (this->count !=
      ((long)this->nextEntry - (long)this->chunkStart >> 3) + (this->pageCount - 1) * 0x1fc) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/PageStack.h"
                       ,0x6a,
                       "(count == (nextEntry - chunkStart) + (pageCount - 1) * EntriesPerChunk)",
                       "count == (nextEntry - chunkStart) + (pageCount - 1) * EntriesPerChunk");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  return true;
}

Assistant:

inline
bool PageStack<T>::Pop(T * item)
{
    Assert(currentChunk != nullptr);

    if (nextEntry == chunkStart)
    {
        // We're at the beginning of the chunk.  Move to the previous chunk, if any
        if (currentChunk->nextChunk == nullptr)
        {
            // All done
            Assert(count == 0);
            return false;
        }

        Chunk * temp = currentChunk;
        currentChunk = currentChunk->nextChunk;
        FreeChunk(temp);

        chunkStart = currentChunk->entries;
        chunkEnd = &currentChunk->entries[EntriesPerChunk];
        nextEntry = chunkEnd;
    }

    Assert(nextEntry > chunkStart && nextEntry <= chunkEnd);

    nextEntry--;
#if defined(_M_IX86) || defined(_M_X64)
    _mm_prefetch((char*) (nextEntry - 1), _MM_HINT_T0);
#endif
    *item = *nextEntry;

#if DBG
    count--;
    Assert(count == (nextEntry - chunkStart) + (pageCount - 1) * EntriesPerChunk);
#endif

    return true;
}